

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxLexer.cpp
# Opt level: O0

void __thiscall Jinx::Impl::Lexer::ParseEndOfLine(Lexer *this)

{
  bool bVar1;
  reference pvVar2;
  Lexer *this_local;
  
  if (*this->m_current == '\r') {
    AdvanceCurrent(this);
  }
  bVar1 = IsEndOfText(this);
  if (!bVar1) {
    if (*this->m_current == '\n') {
      AdvanceCurrent(this);
    }
    bVar1 = std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>::empty
                      (&this->m_symbolList);
    if ((!bVar1) &&
       (pvVar2 = std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>::back
                           (&this->m_symbolList), pvVar2->type != NewLine)) {
      CreateSymbol(this,NewLine);
    }
    this->m_lineNumber = this->m_lineNumber + 1;
    this->m_columnNumber = 1;
    this->m_columnMarker = 1;
  }
  return;
}

Assistant:

inline_t void Lexer::ParseEndOfLine()
	{
		// Handle both Unix and Windows style line ends.
		if (*m_current == '\r')
			AdvanceCurrent();
		if (IsEndOfText())
			return;
		if (*m_current == '\n')
			AdvanceCurrent();
		// No need to add redundant end of line symbols
		if (!m_symbolList.empty() && m_symbolList.back().type != SymbolType::NewLine)
			CreateSymbol(SymbolType::NewLine);
		++m_lineNumber;
		m_columnNumber = 1;
		m_columnMarker = 1;
	}